

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cutMan.c
# Opt level: O2

void Cut_ManPrintStats(Cut_Man_t *p)

{
  int level;
  
  if (p->pReady != (Cut_Cut_t *)0x0) {
    Cut_CutRecycle(p,p->pReady);
    p->pReady = (Cut_Cut_t *)0x0;
  }
  puts("Cut computation statistics:");
  printf("Current cuts      = %8d. (Trivial = %d.)\n",(ulong)(uint)(p->nCutsCur - p->nCutsTriv));
  printf("Peak cuts         = %8d.\n",(ulong)(uint)p->nCutsPeak);
  printf("Total allocated   = %8d.\n",(ulong)(uint)p->nCutsAlloc);
  printf("Total deallocated = %8d.\n",(ulong)(uint)p->nCutsDealloc);
  printf("Cuts filtered     = %8d.\n",(ulong)(uint)p->nCutsFilter);
  printf("Nodes saturated   = %8d. (Max cuts = %d.)\n",(ulong)(uint)p->nCutsLimit,
         (ulong)(uint)p->pParams->nKeepMax);
  printf("Cuts per node     = %8.1f\n",
         (double)((float)(p->nCutsCur - p->nCutsTriv) / (float)p->nNodes));
  printf("The cut size      = %8d bytes.\n",(ulong)(uint)p->EntrySize);
  printf("Peak memory       = %8.2f MB.\n",
         (double)((float)p->EntrySize * (float)p->nCutsPeak * 9.536743e-07));
  printf("Total nodes       = %8d.\n",(ulong)(uint)p->nNodes);
  if ((p->pParams->fDag != 0) || (p->pParams->fTree != 0)) {
    printf("DAG nodes         = %8d.\n",(ulong)(uint)p->nNodesDag);
    printf("Tree nodes        = %8d.\n",(ulong)(uint)(p->nNodes - p->nNodesDag));
  }
  level = 0x7440d6;
  printf("Nodes w/o cuts    = %8d.\n",(ulong)(uint)p->nNodesNoCuts);
  if ((p->pParams->fMap != 0) && (p->pParams->fSeq == 0)) {
    level = 0x7440f0;
    printf("Mapping delay     = %8d.\n",(ulong)(uint)p->nDelayMin);
  }
  Abc_Print(level,"%s =","Merge ");
  Abc_Print(level,"%9.2f sec\n",(double)p->timeMerge / 1000000.0);
  Abc_Print(level,"%s =","Union ");
  Abc_Print(level,"%9.2f sec\n",(double)p->timeUnion / 1000000.0);
  Abc_Print(level,"%s =","Filter");
  Abc_Print(level,"%9.2f sec\n",(double)p->timeFilter / 1000000.0);
  Abc_Print(level,"%s =","Truth ");
  Abc_Print(level,"%9.2f sec\n",(double)p->timeTruth / 1000000.0);
  Abc_Print(level,"%s =","Map   ");
  Abc_Print(level,"%9.2f sec\n",(double)p->timeMap / 1000000.0);
  return;
}

Assistant:

void Cut_ManPrintStats( Cut_Man_t * p )
{
    if ( p->pReady )
    {
        Cut_CutRecycle( p, p->pReady );
        p->pReady = NULL;
    }
    printf( "Cut computation statistics:\n" );
    printf( "Current cuts      = %8d. (Trivial = %d.)\n", p->nCutsCur-p->nCutsTriv, p->nCutsTriv );
    printf( "Peak cuts         = %8d.\n", p->nCutsPeak );
    printf( "Total allocated   = %8d.\n", p->nCutsAlloc );
    printf( "Total deallocated = %8d.\n", p->nCutsDealloc );
    printf( "Cuts filtered     = %8d.\n", p->nCutsFilter );
    printf( "Nodes saturated   = %8d. (Max cuts = %d.)\n", p->nCutsLimit, p->pParams->nKeepMax );
    printf( "Cuts per node     = %8.1f\n", ((float)(p->nCutsCur-p->nCutsTriv))/p->nNodes );
    printf( "The cut size      = %8d bytes.\n", p->EntrySize );
    printf( "Peak memory       = %8.2f MB.\n", (float)p->nCutsPeak * p->EntrySize / (1<<20) );
    printf( "Total nodes       = %8d.\n", p->nNodes );
    if ( p->pParams->fDag || p->pParams->fTree )
    {
    printf( "DAG nodes         = %8d.\n", p->nNodesDag );
    printf( "Tree nodes        = %8d.\n", p->nNodes - p->nNodesDag );
    }
    printf( "Nodes w/o cuts    = %8d.\n", p->nNodesNoCuts );
    if ( p->pParams->fMap && !p->pParams->fSeq )
    printf( "Mapping delay     = %8d.\n", p->nDelayMin );

    ABC_PRT( "Merge ", p->timeMerge );
    ABC_PRT( "Union ", p->timeUnion );
    ABC_PRT( "Filter", p->timeFilter );
    ABC_PRT( "Truth ", p->timeTruth );
    ABC_PRT( "Map   ", p->timeMap );
//    printf( "Nodes = %d. Multi = %d.  Cuts = %d. Multi = %d.\n", 
//        p->nNodes, p->nNodesMulti, p->nCutsCur-p->nCutsTriv, p->nCutsMulti );
//    printf( "Count0 = %d. Count1 = %d. Count2 = %d.\n\n", p->Count0, p->Count1, p->Count2 );
}